

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

char * nullcGetTypeName(uint typeID)

{
  FastVector<char,_false,_false> *this;
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  uint typeID_local;
  
  if (NULLCTypeInfo::linker != 0) {
    this = (FastVector<char,_false,_false> *)(NULLCTypeInfo::linker + 0x290);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(NULLCTypeInfo::linker + 0x200),
                        typeID);
    pcVar2 = FastVector<char,_false,_false>::operator[](this,pEVar1->offsetToName);
    return pcVar2;
  }
  __assert_fail("NULLCTypeInfo::linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x1db,"const char *nullcGetTypeName(unsigned int)");
}

Assistant:

const char*		nullcGetTypeName(unsigned int typeID)
{
	assert(NULLCTypeInfo::linker);
	return &NULLCTypeInfo::linker->exSymbols[NULLCTypeInfo::linker->exTypes[typeID].offsetToName];
}